

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O0

void __thiscall sock1::operator()(sock1 *this,error_code *e)

{
  bool bVar1;
  ssize_t sVar2;
  ostream *poVar3;
  error_code *in_RSI;
  int *in_RDI;
  int n;
  char c;
  sock1 *in_stack_00000030;
  char local_11 [17];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"!e");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x21);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  local_11[0] = -1;
  sVar2 = recv(*in_RDI,local_11,1,0);
  if (in_RDI[4] == 10) {
    if ((int)sVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"n==0");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    booster::aio::io_service::stop();
    done = true;
  }
  else {
    if ((int)local_11[0] != in_RDI[4]) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"c==counter");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    in_RDI[4] = in_RDI[4] + 1;
    async_run(in_stack_00000030);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(!e);
		char c=-1;
		int n = ::recv(fd,&c,1,0);
		if(counter == 10) {
			TEST(n==0);
			srv->stop();
			done=true;
		}
		else  {
			TEST(c==counter);
			counter++;
			async_run();
		}

	}